

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3BtreeCommitPhaseOne(Btree *p,char *zSuperJrnl)

{
  int *piVar1;
  BtShared *pBVar2;
  BtShared *pBt;
  Pager *pPVar3;
  sqlite3 *psVar4;
  u8 *puVar5;
  int iVar6;
  uint uVar7;
  Pgno nFin;
  BtCursor *pBVar8;
  undefined8 uVar9;
  uint uVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  Btree **ppBVar14;
  uint nOrig;
  bool bVar15;
  
  if (p->inTrans != '\x02') {
    return 0;
  }
  pBVar2 = p->pBt;
  if ((p->sharable != '\0') && (p->wantToLock = p->wantToLock + 1, p->locked == '\0')) {
    btreeLockCarefully(p);
  }
  if (pBVar2->autoVacuum != '\0') {
    pBt = p->pBt;
    pPVar3 = pBt->pPager;
    for (pBVar8 = pBt->pCursor; pBVar8 != (BtCursor *)0x0; pBVar8 = pBVar8->pNext) {
      pBVar8->curFlags = pBVar8->curFlags & 0xfb;
    }
    if (pBt->incrVacuum == '\0') {
      nOrig = pBt->nPage;
      uVar7 = 0;
      if (1 < nOrig) {
        iVar6 = (nOrig - 2) - (nOrig - 2) % (pBt->usableSize / 5 + 1);
        uVar7 = iVar6 + (uint)(iVar6 + 1U == (uint)sqlite3PendingByte / pBt->pageSize) + 2;
      }
      if ((uVar7 == nOrig) || (nOrig == (uint)sqlite3PendingByte / pBt->pageSize + 1)) {
        uVar9 = 0x119c9;
      }
      else {
        uVar7 = *(uint *)(pBt->pPage1->aData + 0x24);
        uVar10 = uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 << 0x18;
        psVar4 = p->db;
        uVar7 = uVar10;
        if (psVar4->xAutovacPages != (_func_uint_void_ptr_char_ptr_u32_u32_u32 *)0x0) {
          lVar13 = (long)psVar4->nDb;
          if (lVar13 < 1) {
            lVar12 = 0;
          }
          else {
            ppBVar14 = &psVar4->aDb->pBt;
            lVar11 = 0;
            do {
              lVar12 = lVar11;
              if (*ppBVar14 == p) break;
              lVar11 = lVar11 + 1;
              ppBVar14 = ppBVar14 + 4;
              lVar12 = lVar13;
            } while (lVar13 != lVar11);
          }
          uVar7 = (*psVar4->xAutovacPages)
                            (psVar4->pAutovacPagesArg,psVar4->aDb[lVar12].zDbSName,nOrig,uVar10,
                             pBt->pageSize);
          if (uVar10 <= uVar7) {
            uVar7 = uVar10;
          }
          if (uVar7 == 0) goto LAB_00138d4f;
        }
        nFin = finalDbSize(pBt,nOrig,uVar7);
        if (nFin <= nOrig) {
          if (nFin < nOrig) {
            if ((pBt->pCursor == (BtCursor *)0x0) ||
               (iVar6 = saveCursorsOnList(pBt->pCursor,0,(BtCursor *)0x0), iVar6 == 0)) {
              do {
                iVar6 = incrVacuumStep(pBt,nFin,nOrig,(uint)(uVar7 == uVar10));
                nOrig = nOrig - 1;
                bVar15 = iVar6 == 0;
                if (nOrig <= nFin) break;
              } while (iVar6 == 0);
            }
            else {
              bVar15 = false;
            }
          }
          else {
            bVar15 = true;
            iVar6 = 0;
          }
          if ((!(bool)(iVar6 != 0x65 & (bVar15 ^ 1U))) && (uVar10 != 0)) {
            iVar6 = sqlite3PagerWrite(pBt->pPage1->pDbPage);
            if (uVar7 == uVar10) {
              puVar5 = pBt->pPage1->aData;
              puVar5[0x20] = '\0';
              puVar5[0x21] = '\0';
              puVar5[0x22] = '\0';
              puVar5[0x23] = '\0';
              puVar5 = pBt->pPage1->aData;
              puVar5[0x24] = '\0';
              puVar5[0x25] = '\0';
              puVar5[0x26] = '\0';
              puVar5[0x27] = '\0';
            }
            *(Pgno *)(pBt->pPage1->aData + 0x1c) =
                 nFin >> 0x18 | (nFin & 0xff0000) >> 8 | (nFin & 0xff00) << 8 | nFin << 0x18;
            pBt->bDoTruncate = '\x01';
            pBt->nPage = nFin;
          }
          if (iVar6 != 0) {
            sqlite3PagerRollback(pPVar3);
            goto LAB_00138e03;
          }
          goto LAB_00138d4f;
        }
        uVar9 = 0x119e4;
      }
      iVar6 = 0xb;
      sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",uVar9,
                  "89c459e766ea7e9165d0beeb124708b955a4950d0f4792f457465d71b158d318");
      goto LAB_00138e03;
    }
  }
LAB_00138d4f:
  pPVar3 = pBVar2->pPager;
  if (pBVar2->bDoTruncate != '\0') {
    pPVar3->dbSize = pBVar2->nPage;
  }
  iVar6 = sqlite3PagerCommitPhaseOne(pPVar3,zSuperJrnl,0);
LAB_00138e03:
  if (p->sharable != '\0') {
    piVar1 = &p->wantToLock;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      unlockBtreeMutex(p);
    }
  }
  return iVar6;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeCommitPhaseOne(Btree *p, const char *zSuperJrnl){
  int rc = SQLITE_OK;
  if( p->inTrans==TRANS_WRITE ){
    BtShared *pBt = p->pBt;
    sqlite3BtreeEnter(p);
#ifndef SQLITE_OMIT_AUTOVACUUM
    if( pBt->autoVacuum ){
      rc = autoVacuumCommit(p);
      if( rc!=SQLITE_OK ){
        sqlite3BtreeLeave(p);
        return rc;
      }
    }
    if( pBt->bDoTruncate ){
      sqlite3PagerTruncateImage(pBt->pPager, pBt->nPage);
    }
#endif
    rc = sqlite3PagerCommitPhaseOne(pBt->pPager, zSuperJrnl, 0);
    sqlite3BtreeLeave(p);
  }
  return rc;
}